

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O0

void matrixVectorTest1(void)

{
  ostream *poVar1;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  Vector<float,_4UL> local_1d0;
  undefined1 local_1c0 [8];
  Vector4T<float> b;
  float local_1a8;
  float local_1a4;
  Vector<float,_4UL> local_1a0;
  undefined1 local_190 [8];
  Vector4T<float> a;
  Matrix<float,_4UL,_4UL> local_140;
  Matrix<float,_4UL,_4UL> local_100;
  float local_c0;
  float local_bc;
  float local_b8;
  Vector<float,_3UL> local_b4;
  float local_a8;
  float local_a4;
  float local_a0;
  Vector<float,_3UL> local_9c;
  float local_90;
  float local_8c;
  float local_88;
  Vector<float,_3UL> local_84;
  undefined1 local_78 [8];
  AffineMatrix4 B;
  Matrix4 A;
  
  Gs::Matrix<float,_4UL,_4UL>::Identity();
  Gs::AffineMatrix4T<float>::Identity();
  local_88 = 4.0;
  local_8c = 2.0;
  local_90 = -1.6666666;
  Gs::Vector<float,_3UL>::Vector(&local_84,&local_88,&local_8c,&local_90);
  Gs::Translate<float>((Matrix<float,_4UL,_4UL> *)(B.m_ + 10),&local_84);
  local_a0 = 1.0;
  local_a4 = 2.0;
  local_a8 = 3.0;
  Gs::Vector<float,_3UL>::Vector(&local_9c,&local_a0,&local_a4,&local_a8);
  Gs::Scale<float>((AffineMatrix4T<float> *)local_78,&local_9c);
  local_b8 = 4.0;
  local_bc = 2.0;
  local_c0 = -1.6666666;
  Gs::Vector<float,_3UL>::Vector(&local_b4,&local_b8,&local_bc,&local_c0);
  Gs::Translate<float>((AffineMatrix4T<float> *)local_78,&local_b4);
  poVar1 = std::operator<<((ostream *)&std::cout,"A = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Gs::operator<<(poVar1,(Matrix<float,_4UL,_4UL> *)(B.m_ + 10));
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"B = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Gs::operator<<(poVar1,(AffineMatrix4T<float> *)local_78);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"A^-1 = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Gs::Matrix<float,_4UL,_4UL>::Inverse(&local_100,(Matrix<float,_4UL,_4UL> *)(B.m_ + 10));
  poVar1 = Gs::operator<<(poVar1,&local_100);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"A*A^-1 = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Gs::Matrix<float,_4UL,_4UL>::Inverse
            ((Matrix<float,_4UL,_4UL> *)&a.z,(Matrix<float,_4UL,_4UL> *)(B.m_ + 10));
  Gs::operator*(&local_140,(Matrix<float,_4UL,_4UL> *)(B.m_ + 10),(Matrix<float,_4UL,_4UL> *)&a.z);
  poVar1 = Gs::operator<<(poVar1,&local_140);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_1a4 = 0.0;
  local_1a8 = 0.0;
  b.w = 0.0;
  b.z = 1.0;
  Gs::Vector<float,_4UL>::Vector(&local_1a0,&local_1a4,&local_1a8,&b.w,&b.z);
  Gs::TransformVector<Gs::Matrix<float,4ul,4ul>,float>
            ((Gs *)local_190,(Matrix<float,_4UL,_4UL> *)(B.m_ + 10),&local_1a0);
  local_1d4 = 0.0;
  local_1d8 = 0.0;
  local_1dc = 0.0;
  local_1e0 = 1.0;
  Gs::Vector<float,_4UL>::Vector(&local_1d0,&local_1d4,&local_1d8,&local_1dc,&local_1e0);
  Gs::TransformVector<float>((Gs *)local_1c0,(AffineMatrix4T<float> *)local_78,&local_1d0);
  poVar1 = std::operator<<((ostream *)&std::cout,"a = ");
  poVar1 = Gs::operator<<(poVar1,(Vector<float,_4UL> *)local_190);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"b = ");
  poVar1 = Gs::operator<<(poVar1,(Vector<float,_4UL> *)local_1c0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void matrixVectorTest1()
{
    Matrix4 A = Matrix4::Identity();
    AffineMatrix4 B = AffineMatrix4::Identity();

    Translate(A, Vector3(4, 2, -5.0f/3.0f));
    Scale(B, Vector3(1, 2, 3));
    Translate(B, Vector3(4, 2, -5.0f/3.0f));

    #if 1
    std::cout << "A = " << std::endl << A << std::endl;
    std::cout << "B = " << std::endl << B << std::endl;
    std::cout << "A^-1 = " << std::endl << A.Inverse() << std::endl;
    std::cout << "A*A^-1 = " << std::endl << A*A.Inverse() << std::endl;
    #endif

    auto a = TransformVector(A, Vector4(0, 0, 0, 1));
    auto b = TransformVector(B, Vector4(0, 0, 0, 1));

    //Translate(A, a.xyz()*2.0f);
    //Translate(B, a.yxz());

    std::cout << "a = " << a << std::endl;
    std::cout << "b = " << b << std::endl;
}